

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O0

UCVarValue __thiscall FMaskCVar::GetFavoriteRepDefault(FMaskCVar *this,ECVarType *type)

{
  uint uVar1;
  undefined4 extraout_var;
  undefined1 local_24 [4];
  ECVarType *pEStack_20;
  ECVarType dummy;
  ECVarType *type_local;
  FMaskCVar *this_local;
  UCVarValue def;
  
  pEStack_20 = type;
  type_local = (ECVarType *)this;
  uVar1 = (*(this->ValueVar->super_FBaseCVar)._vptr_FBaseCVar[7])(this->ValueVar,local_24);
  this_local = (FMaskCVar *)
               CONCAT44(extraout_var,(uVar1 & this->BitVal) >> ((byte)this->BitNum & 0x1f));
  *pEStack_20 = CVAR_Int;
  return (UCVarValue)((GUID *)this_local).String;
}

Assistant:

UCVarValue FMaskCVar::GetFavoriteRepDefault (ECVarType *type) const
{
	ECVarType dummy;
	UCVarValue def;
	def = ValueVar.GetFavoriteRepDefault (&dummy);
	def.Int = (def.Int & BitVal) >> BitNum;
	*type = CVAR_Int;
	return def;
}